

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall solitaire::graphics::Renderer::renderPiles(Renderer *this)

{
  PileId id;
  uint uVar1;
  PileId local_20;
  PileId local_1c;
  
  for (uVar1 = 0; uVar1 != 4; uVar1 = uVar1 + 1) {
    local_1c.t = uVar1;
    renderFoundationPile(this,&local_1c);
  }
  for (uVar1 = 0; uVar1 != 7; uVar1 = uVar1 + 1) {
    local_20.t = uVar1;
    renderTableauPile(this,&local_20);
  }
  renderStockPile(this);
  renderCardsInHand(this);
  return;
}

Assistant:

void Renderer::renderPiles() const {
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        renderFoundationPile(id);

    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        renderTableauPile(id);

    renderStockPile();
    renderCardsInHand();
}